

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O1

size_t ssh1channel_write(SshChannel *sc,_Bool is_stderr,void *buf,size_t len)

{
  ConnectionLayer *pCVar1;
  long lVar2;
  undefined7 in_register_00000031;
  
  if (((ulong)sc[-1].vt & 1) == 0) {
    pCVar1 = sc[-3].cl;
    lVar2 = (**(code **)((pCVar1[0xf].vt)->rportfwd_alloc + 0x18))
                      (0x17,CONCAT71(in_register_00000031,is_stderr));
    BinarySink_put_uint32((BinarySink *)(lVar2 + 0x60),(ulong)*(uint *)&sc[-2].vt);
    BinarySink_put_string((BinarySink *)(lVar2 + 0x60),buf,len);
    pq_base_push((PacketQueueBase *)pCVar1[0x10].vt,(PacketQueueNode *)(lVar2 + 0x40));
    return 0;
  }
  __assert_fail("!(c->closes & CLOSES_SENT_CLOSE)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection1.c"
                ,0x266,"size_t ssh1channel_write(SshChannel *, _Bool, const void *, size_t)");
}

Assistant:

static size_t ssh1channel_write(
    SshChannel *sc, bool is_stderr, const void *buf, size_t len)
{
    struct ssh1_channel *c = container_of(sc, struct ssh1_channel, sc);
    struct ssh1_connection_state *s = c->connlayer;

    assert(!(c->closes & CLOSES_SENT_CLOSE));

    PktOut *pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_CHANNEL_DATA);
    put_uint32(pktout, c->remoteid);
    put_string(pktout, buf, len);
    pq_push(s->ppl.out_pq, pktout);

    /*
     * In SSH-1 we can return 0 here - implying that channels are
     * never individually throttled - because the only circumstance
     * that can cause throttling will be the whole SSH connection
     * backing up, in which case _everything_ will be throttled as a
     * whole.
     */
    return 0;
}